

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcBooleanClippingResult>
                 (DB *db,LIST *params,IfcBooleanClippingResult *in)

{
  TypeError *this;
  allocator<char> local_39;
  string local_38;
  
  GenericFill<Assimp::IFC::Schema_2x3::IfcBooleanResult>(db,params,&in->super_IfcBooleanResult);
  if (0x20 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(params->members).
                          super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    return 3;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"expected 3 arguments to IfcBooleanClippingResult",&local_39);
  TypeError::TypeError(this,&local_38,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcBooleanClippingResult>(const DB& db, const LIST& params, IfcBooleanClippingResult* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcBooleanResult*>(in));
	if (params.GetSize() < 3) { throw STEP::TypeError("expected 3 arguments to IfcBooleanClippingResult"); }	return base;
}